

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O2

TValue * luaH_set(lua_State *L,Table *t,TValue *key)

{
  TValue *pTVar1;
  char *fmt;
  
  pTVar1 = luaH_get(t,key);
  t->flags = '\0';
  if (pTVar1 != &luaO_nilobject_) {
    return pTVar1;
  }
  if (key->tt == 0) {
    fmt = "table index is nil";
  }
  else {
    if ((key->tt != 3) || (!NAN((key->value).n))) goto LAB_00113bb5;
    fmt = "table index is NaN";
  }
  luaG_runerror(L,fmt);
LAB_00113bb5:
  pTVar1 = newkey(L,t,key);
  return pTVar1;
}

Assistant:

TValue *luaH_set (lua_State *L, Table *t, const TValue *key) {
  const TValue *p = luaH_get(t, key);
  t->flags = 0;
  if (p != luaO_nilobject)
    return cast(TValue *, p);
  else {
    if (ttisnil(key)) luaG_runerror(L, "table index is nil");
    else if (ttisnumber(key) && luai_numisnan(nvalue(key)))
      luaG_runerror(L, "table index is NaN");
    return newkey(L, t, key);
  }
}